

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_HILO(DisasContext_conflict6 *ctx,uint32_t opc,int acc,int reg)

{
  TCGContext_conflict6 *tcg_ctx_00;
  TCGContext_conflict6 *tcg_ctx;
  int reg_local;
  int acc_local;
  uint32_t opc_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if ((reg != 0) || ((opc != 0x10 && (opc != 0x12)))) {
    if (acc != 0) {
      check_dsp(ctx);
    }
    switch(opc) {
    case 0x10:
      if (acc == 0) {
        tcg_gen_mov_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[reg],tcg_ctx_00->cpu_HI[0]);
      }
      else {
        tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[reg],tcg_ctx_00->cpu_HI[acc]);
      }
      break;
    case 0x11:
      if (reg == 0) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_HI[acc],0);
      }
      else if (acc == 0) {
        tcg_gen_mov_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_HI[0],tcg_ctx_00->cpu_gpr[reg]);
      }
      else {
        tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_HI[acc],tcg_ctx_00->cpu_gpr[reg]);
      }
      break;
    case 0x12:
      if (acc == 0) {
        tcg_gen_mov_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[reg],tcg_ctx_00->cpu_LO[0]);
      }
      else {
        tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[reg],tcg_ctx_00->cpu_LO[acc]);
      }
      break;
    case 0x13:
      if (reg == 0) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_LO[acc],0);
      }
      else if (acc == 0) {
        tcg_gen_mov_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_LO[0],tcg_ctx_00->cpu_gpr[reg]);
      }
      else {
        tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_LO[acc],tcg_ctx_00->cpu_gpr[reg]);
      }
    }
  }
  return;
}

Assistant:

static void gen_HILO(DisasContext *ctx, uint32_t opc, int acc, int reg)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (reg == 0 && (opc == OPC_MFHI || opc == OPC_MFLO)) {
        /* Treat as NOP. */
        return;
    }

    if (acc != 0) {
        check_dsp(ctx);
    }

    switch (opc) {
    case OPC_MFHI:
#if defined(TARGET_MIPS64)
        if (acc != 0) {
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[reg], tcg_ctx->cpu_HI[acc]);
        } else
#endif
        {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[reg], tcg_ctx->cpu_HI[acc]);
        }
        break;
    case OPC_MFLO:
#if defined(TARGET_MIPS64)
        if (acc != 0) {
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[reg], tcg_ctx->cpu_LO[acc]);
        } else
#endif
        {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[reg], tcg_ctx->cpu_LO[acc]);
        }
        break;
    case OPC_MTHI:
        if (reg != 0) {
#if defined(TARGET_MIPS64)
            if (acc != 0) {
                tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_HI[acc], tcg_ctx->cpu_gpr[reg]);
            } else
#endif
            {
                tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_HI[acc], tcg_ctx->cpu_gpr[reg]);
            }
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_HI[acc], 0);
        }
        break;
    case OPC_MTLO:
        if (reg != 0) {
#if defined(TARGET_MIPS64)
            if (acc != 0) {
                tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_LO[acc], tcg_ctx->cpu_gpr[reg]);
            } else
#endif
            {
                tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_LO[acc], tcg_ctx->cpu_gpr[reg]);
            }
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_LO[acc], 0);
        }
        break;
    }
}